

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O0

void scrollbar_timer_proc(Am_Object *interp,Am_Time *elapsed_time)

{
  Am_Value *pAVar1;
  Am_Inter_Location local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Value local_90;
  Am_Object local_80;
  Am_Object scroll_command;
  Am_Object inter_command;
  Am_Object inter;
  Am_Object scrollbar;
  undefined1 local_58 [8];
  Am_Timer_Method method;
  Am_Time local_30;
  Am_Time local_28;
  Am_Time delay;
  bool first_tick;
  Am_Time *elapsed_time_local;
  Am_Object *interp_local;
  
  pAVar1 = Am_Object::Get(interp,0x1ba,0);
  delay.data._7_1_ = Am_Value::operator_cast_to_bool(pAVar1);
  if ((bool)delay.data._7_1_) {
    pAVar1 = Am_Object::Get(interp,0xe9,0);
    Am_Time::Am_Time(&local_28,pAVar1);
    Am_Time::Am_Time(&local_30,&local_28);
    Am_Object::Am_Object((Am_Object *)&method.Call,interp);
    Am_Register_Timer(&local_30,(Am_Object *)&method.Call,0xe8,false);
    Am_Object::~Am_Object((Am_Object *)&method.Call);
    Am_Time::~Am_Time(&local_30);
    Am_Object::Set(interp,0x1ba,false,0);
    Am_Time::~Am_Time(&local_28);
  }
  pAVar1 = Am_Object::Get(&Am_Stepping_Animator,0xe8,0);
  Am_Timer_Method::Am_Timer_Method((Am_Timer_Method *)local_58,pAVar1);
  Am_Object::Am_Object(&scrollbar,interp);
  (*(code *)method.from_wrapper)(&scrollbar,elapsed_time);
  Am_Object::~Am_Object(&scrollbar);
  pAVar1 = Am_Object::Get(interp,0x193,0);
  Am_Object::Am_Object(&inter,pAVar1);
  pAVar1 = Am_Object::Get(interp,0x1ac,0);
  Am_Object::Am_Object(&inter_command,pAVar1);
  pAVar1 = Am_Object::Get(&inter_command,0xc5,0);
  Am_Object::Am_Object(&scroll_command,pAVar1);
  pAVar1 = Am_Object::Get(&inter,0xc5,0);
  Am_Object::Am_Object(&local_80,pAVar1);
  pAVar1 = Am_Object::Get(interp,0x169,0);
  Am_Value::Am_Value(&local_90,pAVar1);
  Am_Object::Am_Object(&local_98,&inter);
  Am_Object::Am_Object(&local_a0,&local_80);
  Am_Object::Am_Object(&local_a8,&scroll_command);
  set_scrollbar_and_commands(&local_90,&local_98,&local_a0,&local_a8,false);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_98);
  Am_Value::~Am_Value(&local_90);
  Am_Object::Am_Object(&local_b0,&inter_command);
  Am_Object::Am_Object(&local_b8,&scroll_command);
  Am_Object::Am_Object(&local_c0,&Am_No_Object);
  Am_Inter_Location::Am_Inter_Location(&local_c8,&Am_No_Location);
  Am_Register_For_Undo(&local_b0,&local_b8,&local_c0,&local_c8,(Am_Impl_Command_Setter *)0x0);
  Am_Inter_Location::~Am_Inter_Location(&local_c8);
  Am_Object::~Am_Object(&local_c0);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&scroll_command);
  Am_Object::~Am_Object(&inter_command);
  Am_Object::~Am_Object(&inter);
  return;
}

Assistant:

Am_Define_Method(Am_Timer_Method, void, scrollbar_timer,
                 (Am_Object interp, const Am_Time &elapsed_time))
{
  bool first_tick = interp.Get(Am_FIRST_TICK);

  if (first_tick) {
    // set a continuous timer for every REPEAT_DELAY
    Am_Time delay = interp.Get(Am_REPEAT_DELAY);
    Am_Register_Timer(delay, interp, Am_ANIMATION_METHOD, false);
    interp.Set(Am_FIRST_TICK, false);
  }

  // call the stepper now
  Am_Timer_Method method = Am_Stepping_Animator.Get(Am_ANIMATION_METHOD);
  method.Call(interp, elapsed_time);

  // propagate values to the scrollbar's various parts
  Am_Object scrollbar = interp.Get(Am_OPERATES_ON);
  Am_Object inter = interp.Get(Am_INTERACTOR);
  Am_Object inter_command = inter.Get(Am_COMMAND);
  Am_Object scroll_command = scrollbar.Get(Am_COMMAND);
  set_scrollbar_and_commands(interp.Get(Am_VALUE), scrollbar, scroll_command,
                             inter_command, false);
  //pretend this is a final function, so call all parent methods
  Am_Register_For_Undo(inter, inter_command, Am_No_Object, Am_No_Location,
                       (nullptr));
}